

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpression.cxx
# Opt level: O0

size_type cmGeneratorExpression::Find(string *input)

{
  long lVar1;
  size_type openpos;
  string *input_local;
  
  input_local = (string *)std::__cxx11::string::find((char *)input,0xa31f1d);
  if ((input_local == (string *)0xffffffffffffffff) ||
     (lVar1 = std::__cxx11::string::find((char)input,0x3e), lVar1 == -1)) {
    input_local = (string *)0xffffffffffffffff;
  }
  return (size_type)input_local;
}

Assistant:

std::string::size_type cmGeneratorExpression::Find(const std::string& input)
{
  const std::string::size_type openpos = input.find("$<");
  if (openpos != std::string::npos &&
      input.find('>', openpos) != std::string::npos) {
    return openpos;
  }
  return std::string::npos;
}